

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O2

int __thiscall
event_track::ingest_event_stream::print_samples_from_file
          (ingest_event_stream *this,istream *infile,bool init_only)

{
  string *psVar1;
  pointer puVar2;
  bool bVar3;
  int iVar4;
  uint32_t uVar5;
  ssize_t sVar6;
  ostream *poVar7;
  uint j;
  size_t in_RCX;
  ulong uVar8;
  void *__buf;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  pointer pbVar12;
  uint64_t presentation_time;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sample_data;
  vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_> ingest_boxes;
  exception e;
  EventMessageInstanceBox im_box;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_5a0;
  ulong local_588;
  ingest_event_stream *local_580;
  vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_> local_578;
  box *local_560;
  box *local_558;
  box *local_550;
  box *local_548;
  long local_540;
  ulong local_538;
  media_fragment local_530;
  string local_148;
  string local_128;
  DASHEventMessageBoxv1 local_108;
  
  if (((byte)infile[*(long *)(*(long *)infile + -0x18) + 0x20] & 5) == 0) {
    local_578.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_578.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>._M_impl.
    super__Vector_impl_data._M_start = (box *)0x0;
    local_578.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>._M_impl.
    super__Vector_impl_data._M_finish = (box *)0x0;
    local_580 = this;
    do {
      if (*(int *)(infile + *(long *)(*(long *)infile + -0x18) + 0x20) != 0) break;
      fmp4_stream::box::box(&local_530.styp_);
      sVar6 = fmp4_stream::box::read(&local_530.styp_,(int)infile,__buf,in_RCX);
      if ((char)sVar6 == '\0') {
        fmp4_stream::box::~box(&local_530.styp_);
        break;
      }
      std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>::push_back
                (&local_578,&local_530.styp_);
      iVar4 = std::__cxx11::string::compare((char *)&local_530.styp_.box_type_);
      fmp4_stream::box::~box(&local_530.styp_);
    } while (iVar4 != 0);
    local_548 = &(local_580->super_ingest_stream).init_fragment_.moov_box_;
    local_550 = &(local_580->super_ingest_stream).mfra_box_;
    local_558 = &(local_580->super_ingest_stream).sidx_box_;
    local_560 = &(local_580->super_ingest_stream).meta_box_;
    pbVar12 = local_578.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>.
              _M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      if (pbVar12 ==
          local_578.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>._M_impl.
          super__Vector_impl_data._M_finish) break;
      psVar1 = &pbVar12->box_type_;
      iVar4 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar4 == 0) {
        fmp4_stream::box::operator=((box *)local_580,pbVar12);
      }
      iVar4 = std::__cxx11::string::compare((char *)psVar1);
      if ((iVar4 == 0) && (fmp4_stream::box::operator=(local_548,pbVar12), init_only)) {
        std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>::~vector(&local_578);
        return 0;
      }
      iVar4 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar4 == 0) {
        fmp4_stream::box::box(&local_530.styp_);
        fmp4_stream::box::box(&local_530.prft_);
        local_530.emsg_.super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        local_530._225_8_ = 0;
        local_530.emsg_.super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_530.emsg_.super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
        local_530.emsg_.super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>.
        _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
        fmp4_stream::box::box(&local_530.moof_box_);
        fmp4_stream::box::box(&local_530.mdat_box_);
        local_530.trex_.track_id_ = 0;
        local_530.trex_.default_sample_description_index_ = 0;
        local_530.trex_.default_sample_duration_ = 0;
        local_530.trex_.default_sample_size_ = 0;
        local_530.trex_.default_sample_flags_ = 0;
        fmp4_stream::mfhd::mfhd(&local_530.mfhd_);
        fmp4_stream::tfhd::tfhd(&local_530.tfhd_);
        fmp4_stream::tfdt::tfdt(&local_530.tfdt_);
        fmp4_stream::trun::trun(&local_530.trun_);
        fmp4_stream::box::operator=(&local_530.moof_box_,pbVar12);
        fmp4_stream::media_fragment::parse_moof(&local_530);
        poVar7 = std::operator<<((ostream *)&std::cout,
                                 "==  found movie fragment with base media decode time: ");
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::endl<char,std::char_traits<char>>(poVar7);
        if ((local_530.tfhd_.default_base_is_moof_ == true) &&
           (local_530.trun_.data_offset_ - 8U == local_530.moof_box_.size_)) {
          iVar4 = std::__cxx11::string::compare((char *)&pbVar12[1].box_type_);
          if (((iVar4 == 0) &&
              (fmp4_stream::box::operator=(&local_530.mdat_box_,pbVar12 + 1),
              local_530.trun_.sample_duration_present_ == true)) &&
             (local_530.trun_.sample_size_present_ == true)) {
            local_588 = 0;
            uVar9 = 0;
            presentation_time = local_530.tfdt_.base_media_decode_time_;
            while (uVar9 < (ulong)((long)local_530.trun_.m_sentry.
                                         super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_530.trun_.m_sentry.
                                         super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5)) {
              uVar10 = local_530.trun_.m_sentry.
                       super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar9].sample_size_;
              local_538 = uVar9;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_5a0,
                         (ulong)uVar10,(allocator_type *)&local_108);
              poVar7 = std::operator<<((ostream *)&std::cout,"== found sample, presentation time = "
                                      );
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
              poVar7 = std::operator<<(poVar7," duration = ");
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
              poVar7 = std::operator<<(poVar7," sample size = ");
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
              poVar7 = std::operator<<(poVar7," == ");
              std::endl<char,std::char_traits<char>>(poVar7);
              puVar2 = local_5a0._M_impl.super__Vector_impl_data._M_start;
              for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
                local_5a0._M_impl.super__Vector_impl_data._M_start[uVar8] =
                     local_530.mdat_box_.box_data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start[(uint)((int)local_588 + 8 + (int)uVar8)];
              }
              local_540 = uVar9 * 0x20;
              if (uVar10 < 9) {
                poVar7 = std::operator<<((ostream *)&std::cout,"empty sample (embe/emeb): ");
                std::endl<char,std::char_traits<char>>(poVar7);
              }
              else {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_128,"emib",(allocator<char> *)&local_108);
                bVar3 = compare_4cc((char *)(puVar2 + 4),&local_128);
                std::__cxx11::string::~string((string *)&local_128);
                puVar2 = local_5a0._M_impl.super__Vector_impl_data._M_start;
                if (bVar3) {
                  for (uVar11 = 0;
                      (ulong)uVar11 <
                      (ulong)(CONCAT44(local_5a0._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                       (int)local_5a0._M_impl.super__Vector_impl_data._M_finish) -
                             (long)local_5a0._M_impl.super__Vector_impl_data._M_start);
                      uVar11 = uVar5 + uVar11) {
                    EventMessageInstanceBox::EventMessageInstanceBox
                              ((EventMessageInstanceBox *)&local_108);
                    uVar5 = EventMessageInstanceBox::parse
                                      ((EventMessageInstanceBox *)&local_108,
                                       (char *)(local_5a0._M_impl.super__Vector_impl_data._M_start +
                                               uVar11),
                                       (int)local_5a0._M_impl.super__Vector_impl_data._M_finish -
                                       (int)local_5a0._M_impl.super__Vector_impl_data._M_start,
                                       presentation_time);
                    EventMessageInstanceBox::print((EventMessageInstanceBox *)&local_108);
                    EventMessageInstanceBox::~EventMessageInstanceBox
                              ((EventMessageInstanceBox *)&local_108);
                  }
                }
                else {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_148,"emsg",(allocator<char> *)&local_108);
                  bVar3 = compare_4cc((char *)(puVar2 + 4),&local_148);
                  std::__cxx11::string::~string((string *)&local_148);
                  if (bVar3) {
                    for (uVar11 = 0;
                        (ulong)uVar11 <
                        (ulong)(CONCAT44(local_5a0._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                         (int)local_5a0._M_impl.super__Vector_impl_data._M_finish) -
                               (long)local_5a0._M_impl.super__Vector_impl_data._M_start);
                        uVar11 = uVar5 + uVar11) {
                      DASHEventMessageBoxv1::DASHEventMessageBoxv1(&local_108);
                      uVar5 = DASHEventMessageBoxv1::parse
                                        (&local_108,
                                         (char *)(local_5a0._M_impl.super__Vector_impl_data._M_start
                                                 + uVar11),
                                         (int)local_5a0._M_impl.super__Vector_impl_data._M_finish -
                                         (int)local_5a0._M_impl.super__Vector_impl_data._M_start,
                                         presentation_time);
                      DASHEventMessageBoxv1::print(&local_108);
                      DASHEventMessageBoxv1::~DASHEventMessageBoxv1(&local_108);
                    }
                  }
                }
              }
              uVar10 = uVar10 + (int)local_588;
              presentation_time =
                   presentation_time +
                   *(uint *)((long)&(local_530.trun_.m_sentry.
                                     super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->sample_duration_ +
                            local_540);
              Catch::clara::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::
              ~_Vector_base(&local_5a0);
              local_588 = (ulong)uVar10;
              uVar9 = local_538 + 1;
            }
          }
        }
        else {
          poVar7 = std::operator<<((ostream *)&std::cout,
                                   "error only CMAF based metadata tracks supported with default_base_is_moof and mdat immediately following"
                                  );
          std::endl<char,std::char_traits<char>>(poVar7);
        }
        fmp4_stream::media_fragment::~media_fragment(&local_530);
        pbVar12 = pbVar12 + 1;
      }
      psVar1 = &pbVar12->box_type_;
      iVar4 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar4 == 0) {
        fmp4_stream::box::operator=(local_550,pbVar12);
      }
      iVar4 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar4 == 0) {
        fmp4_stream::box::operator=(local_558,pbVar12);
        std::operator<<((ostream *)&std::cout,"|sidx|");
      }
      iVar4 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar4 == 0) {
        fmp4_stream::box::operator=(local_560,pbVar12);
        std::operator<<((ostream *)&std::cout,"|meta|");
      }
      pbVar12 = pbVar12 + 1;
    }
    std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>::~vector(&local_578);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar7 = std::operator<<((ostream *)&std::cout,"***  finished reading fmp4 fragments  ***");
  std::endl<char,std::char_traits<char>>(poVar7);
  return 0;
}

Assistant:

int event_track::ingest_event_stream::print_samples_from_file(std::istream &infile, bool init_only)
{
	try
	{
		if (infile)
		{
			std::vector<box> ingest_boxes;

			while (infile.good()) // read box by box in a vector
			{
				box b = {};

				if (b.read(infile))
					ingest_boxes.push_back(b);
				else  // break when we have boxes of size zero
					break;

				if (b.box_type_.compare("mfra") == 0)
					break;
			}

			// organize the boxes in init fragments and media fragments 
			for (auto it = ingest_boxes.begin(); it != ingest_boxes.end(); ++it)
			{
				if (it->box_type_.compare("ftyp") == 0)
				{
					//cout << "|ftyp|";
					init_fragment_.ftyp_box_ = *it;
				}
				if (it->box_type_.compare("moov") == 0)
				{
					//cout << "|moov|";
					init_fragment_.moov_box_ = *it;

					if (init_only)
						return 0;
				}

				if (it->box_type_.compare("moof") == 0) // in case of moof box we push both the moof and following mdat
				{
					media_fragment m = {};
					m.moof_box_ = *it;
					m.parse_moof();
					bool mdat_found = false;
					std::cout << "==  found movie fragment with base media decode time: " << m.tfdt_.base_media_decode_time_ << std::endl;
					it++;

					// only support default base is moof and mdat immediately following (CMAF)
					if (m.tfhd_.default_base_is_moof_ && (m.trun_.data_offset_ - 8) == m.moof_box_.size_) {

						if (it->box_type_.compare("mdat") == 0)
						{
							m.mdat_box_ = *it;
							uint64_t pres_time = m.tfdt_.base_media_decode_time_;
							uint32_t data_offset = 0;

							if (m.trun_.sample_duration_present_ && m.trun_.sample_size_present_)
							{
								for (int i = 0; i < m.trun_.m_sentry.size(); i++)
								{
									uint32_t ss = m.trun_.m_sentry[i].sample_size_;
									std::vector<uint8_t> sample_data(ss);
									std::cout << "== found sample, presentation time = " << pres_time <<
										" duration = " \
										<< m.trun_.m_sentry[i].sample_duration_ << " sample size = " << m.trun_.m_sentry[i].sample_size_ << " == " << std::endl;
									for (unsigned int j = 0; j < ss; j++)
										sample_data[j] = m.mdat_box_.box_data_[8 + data_offset + j];

									//parse_event_sample(sample_data,uint64_t presentation_time, )
									unsigned int bts = 0;
									if (ss > 8)
									{
										if (compare_4cc((char *) &sample_data[4], "emib")) {
											while (bts < sample_data.size()) {
												EventMessageInstanceBox im_box;
												bts += im_box.parse((char *)sample_data.data() + bts, (unsigned int)sample_data.size(),pres_time);
												im_box.print();
											}
										}
										else if (compare_4cc((char *)&sample_data[4], "emsg"))
										{
											while (bts < sample_data.size()) 
											{
												DASHEventMessageBoxv1 e;
												bts += e.parse((char *)sample_data.data() + bts, (unsigned int) sample_data.size(),pres_time);
												e.print();
											}
										}
									}
									else
									{
										std::cout << "empty sample (embe/emeb): " << std::endl;
									}

									data_offset += ss;
									pres_time += m.trun_.m_sentry[i].sample_duration_;
								}
							}
						}
					}
					else
					{
						std::cout << "error only CMAF based metadata tracks supported with default_base_is_moof and mdat immediately following" << std::endl;
					}
				}
				if (it->box_type_.compare("mfra") == 0)
				{
					this->mfra_box_ = *it;
				}
				if (it->box_type_.compare("sidx") == 0)
				{
					this->sidx_box_ = *it;
					std::cout << "|sidx|";
				}
				if (it->box_type_.compare("meta") == 0)
				{
					this->meta_box_ = *it;
					std::cout << "|meta|";
				}
			}
		}
		std::cout << std::endl;
		std::cout << "***  finished reading fmp4 fragments  ***" << std::endl;

		return 0;
	}
	catch (std::exception e)
	{
		std::cout << e.what() << std::endl;
		return 0;
	}
}